

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::detail::
task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
::
task_impl_base<void(&)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
           *this,bool has_name,string *name,
          _func_void_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_ptr_vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_ptr_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_ptr_int_bool_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *functor,shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                   *parents,
          shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
          *parents_1,
          shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
          parents_2,shared_ptr<transwarp::task<int>_> parents_3,
          shared_ptr<transwarp::task<bool>_> parents_4,
          shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
          parents_5,
          shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          parents_6,
          shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          parents_7)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  node *__p;
  size_type *local_50;
  size_type local_40;
  undefined8 uStack_38;
  
  *(undefined1 (*) [16])(this + 8) = (undefined1  [16])0x0;
  *(undefined ***)this = &PTR__task_impl_base_001ec3f8;
  this[0x18] = (task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
                )0x1;
  *(undefined1 (*) [16])(this + 0x20) = (undefined1  [16])0x0;
  __p = (node *)operator_new(0x80);
  __p->id_ = 0;
  __p->level_ = 0;
  __p->type_ = root;
  (__p->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->executor_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__p->parents_).
    super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__p->custom_data_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (__p->canceled_)._M_base._M_i = false;
  *(undefined4 *)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(undefined4 *)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(node **)(this + 0x30) = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<transwarp::node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x38),__p);
  *(_func_void_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_ptr_vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_ptr_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_ptr_int_bool_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
    **)(this + 0x40) = functor;
  std::
  tuple<std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>,_std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::shared_ptr<transwarp::task<int>_>,_std::shared_ptr<transwarp::task<bool>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  tuple<std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>,_std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::shared_ptr<transwarp::task<int>_>,_std::shared_ptr<transwarp::task<bool>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
            ((tuple<std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>,_std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::shared_ptr<transwarp::task<int>_>,_std::shared_ptr<transwarp::task<bool>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(this + 0x48),parents,parents_1,
             (shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
              *)parents_2.
                super___shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,
             (shared_ptr<transwarp::task<int>_> *)
             parents_2.
             super___shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,
             (shared_ptr<transwarp::task<bool>_> *)
             parents_3.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
              *)parents_3.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi,
             (shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)parents_4.super___shared_ptr<transwarp::task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,
             (shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)parents_4.super___shared_ptr<transwarp::task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi);
  this[200] = (task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
               )0x0;
  memset(this + 0xd0,0,0x88);
  *(undefined1 (*) [16])(this + 0x158) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x168) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x178) = (undefined1  [16])0x0;
  local_50 = (size_type *)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50 == paVar1) {
    local_40 = paVar1->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&name->field_2 + 8);
    local_50 = &local_40;
  }
  else {
    local_40 = paVar1->_M_allocated_capacity;
  }
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  task_impl_base<$1a67ba37$>::init
            ((task_impl_base<_1a67ba37_> *)this,(EVP_PKEY_CTX *)(ulong)has_name);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

task_impl_base(bool has_name, std::string name, F&& functor, std::shared_ptr<transwarp::task<ParentResults>>... parents)
    : node_(new transwarp::node),
      functor_(std::forward<F>(functor)),
      parents_(std::move(parents)...)
    {
        init(has_name, std::move(name));
    }